

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boardtest.h
# Opt level: O2

void __thiscall test::BoardTest::SetUp(BoardTest *this)

{
  allocator<char> local_31;
  string local_30;
  
  UnitTest::SetUp(&this->super_UnitTest);
  board::Board::INIT();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,board::Board::DEFAULT_FEN,&local_31);
  board::Board::parseFen(&this->pos,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

virtual void SetUp()
    {
        UnitTest::SetUp();

        board::Board::INIT();
        pos.parseFen(board::Board::DEFAULT_FEN);
    }